

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall
QSslSocket::connectToHostEncrypted
          (QSslSocket *this,QString *hostName,quint16 port,OpenMode mode,
          NetworkLayerProtocol protocol)

{
  bool bVar1;
  QSslSocketPrivate *this_00;
  undefined4 in_ECX;
  undefined2 in_DX;
  undefined8 in_RSI;
  char *ctx;
  long *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff40;
  QSslSocketPrivate *this_01;
  char local_70 [32];
  char local_50 [36];
  undefined4 local_2c;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = in_ECX;
  this_00 = d_func((QSslSocket *)0x3a0589);
  if (((this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state == ConnectedState) ||
     ((this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state == ConnectingState)) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_stack_ffffffffffffff40,
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a0601);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (char *)0x3a0617);
      QMessageLogger::warning
                (local_50,
                 "QSslSocket::connectToHostEncrypted() called when already connecting/connected");
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    bVar1 = supportsSsl();
    if (bVar1) {
      ctx = "QSslSocket::connectToHostEncrypted:";
      bVar1 = QSslSocketPrivate::verifyProtocolSupported(this_00,(char *)in_RDI);
      if (bVar1) {
        QSslSocketPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
        this_00->autoStartHandshake = true;
        (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 1;
        (**(code **)(*in_RDI + 0xf8))(in_RDI,in_RSI,in_DX,local_2c,in_R8D);
      }
    }
    else {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_stack_ffffffffffffff40,
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a0699);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)in_RDI,
                   (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (char *)0x3a06af);
        QMessageLogger::warning
                  (local_70,"QSslSocket::connectToHostEncrypted: TLS initialization failed");
        local_20 = local_20 & 0xffffffffffffff00;
      }
      this_01 = this_00;
      tr((char *)in_RDI,(char *)this_00,in_stack_ffffffffffffff3c);
      QAbstractSocketPrivate::setErrorAndEmit
                ((QAbstractSocketPrivate *)this_01,(SocketError)((ulong)in_RDI >> 0x20),
                 (QString *)this_00);
      QString::~QString((QString *)0x3a070e);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::connectToHostEncrypted(const QString &hostName, quint16 port, OpenMode mode, NetworkLayerProtocol protocol)
{
    Q_D(QSslSocket);
    if (d->state == ConnectedState || d->state == ConnectingState) {
        qCWarning(lcSsl,
                  "QSslSocket::connectToHostEncrypted() called when already connecting/connected");
        return;
    }

    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::connectToHostEncrypted: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }

    if (!d->verifyProtocolSupported("QSslSocket::connectToHostEncrypted:"))
        return;

    d->init();
    d->autoStartHandshake = true;
    d->initialized = true;

    // Note: When connecting to localhost, some platforms (e.g., HP-UX and some BSDs)
    // establish the connection immediately (i.e., first attempt).
    connectToHost(hostName, port, mode, protocol);
}